

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

int Nwk_ManGetAigNodeNum(Nwk_Man_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int i;
  
  iVar3 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(pNtk->vObjs,i);
    if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x20) & 7) == 3)) {
      if (*(Hop_Obj_t **)((long)pvVar2 + 8) == (Hop_Obj_t *)0x0) {
        printf("Nwk_ManGetAigNodeNum(): Local AIG of node %d is not assigned.\n",
               (ulong)*(uint *)((long)pvVar2 + 0x24));
      }
      else if (1 < *(int *)((long)pvVar2 + 0x3c)) {
        iVar1 = Hop_DagSize(*(Hop_Obj_t **)((long)pvVar2 + 8));
        iVar3 = iVar3 + iVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

int Nwk_ManGetAigNodeNum( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, nNodes = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        if ( pNode->pFunc == NULL )
        {
            printf( "Nwk_ManGetAigNodeNum(): Local AIG of node %d is not assigned.\n", pNode->Id );
            continue;
        }
        if ( Nwk_ObjFaninNum(pNode) < 2 )
            continue;
        nNodes += Hop_DagSize( pNode->pFunc );
    }
    return nNodes;
}